

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontNonSym<std::complex<long_double>_>_>
                *this,TPZFMatrix<std::complex<long_double>_> *b)

{
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZStackEqnStorage<std::complex<long_double>_>::Forward
            (&this->fStorage,b,
             (this->fFront).super_TPZFront<std::complex<long_double>_>.fDecomposeType);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}